

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::PreprocessorCaseGroup::PreprocessorCase::iterate(PreprocessorCase *this)

{
  glUseProgramFunc p_Var1;
  glUniform1iFunc p_Var2;
  glGetUniformLocationFunc p_Var3;
  glUniform4fFunc p_Var4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  GLenum GVar8;
  GLint GVar9;
  TestLog *log_00;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  char *pcVar11;
  mapped_type *pmVar12;
  TestError *this_00;
  GLSLVersion glslVersion;
  char *local_5d8;
  RGBA local_49c;
  RGBA local_498;
  undefined1 local_491;
  undefined1 local_490 [7];
  bool pass;
  undefined1 local_468 [8];
  Surface resultSurface;
  allocator<char> local_431;
  string local_430;
  undefined1 local_410 [8];
  VertexArrayBinding posBinding;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  string local_370;
  ProgramSources local_350;
  undefined1 local_280 [8];
  ShaderProgram p;
  string local_1a8;
  StringTemplate local_188;
  undefined1 local_168 [8];
  string frgSrc;
  key_type local_140;
  allocator<char> local_119;
  key_type local_118;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  undefined1 local_88 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  undefined1 local_48 [8];
  FBOSentry fbo;
  int dim;
  Functions *gl;
  TestLog *log;
  PreprocessorCase *this_local;
  Functions *gl_00;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar10->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar6);
  fbo._20_4_ = 4;
  bVar5 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar5) {
    FBOSentry::FBOSentry((FBOSentry *)local_48,gl_00,4,4,0x8058);
    (*gl_00->clearColor)(0.125,0.125,0.125,1.0);
    (*gl_00->clear)(0x4000);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_88);
    pcVar11 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"VERSION_DIRECTIVE",&local_a9);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_88,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar12,pcVar11);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    if (this->m_behaviour == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"EXTENSION_DIRECTIVE",
                 (allocator<char> *)(frgSrc.field_2._M_local_buf + 0xf));
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_88,&local_140);
      std::__cxx11::string::operator=((string *)pmVar12,"");
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)(frgSrc.field_2._M_local_buf + 0xf));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"#extension GL_KHR_blend_equation_advanced : ",&local_f1);
      std::operator+(&local_d0,&local_f0,this->m_behaviour);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"EXTENSION_DIRECTIVE",&local_119);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_88,&local_118);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    pcVar11 = iterate::frgSrcTemplate;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,pcVar11,
               (allocator<char> *)((long)&p.m_program.m_info.linkTimeUs + 7));
    tcu::StringTemplate::StringTemplate(&local_188,&local_1a8);
    tcu::StringTemplate::specialize
              ((string *)local_168,&local_188,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_88);
    tcu::StringTemplate::~StringTemplate(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&p.m_program.m_info.linkTimeUs + 7));
    pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    GetDef2DVtxSrc_abi_cxx11_(&local_390,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,pcVar11,&local_391);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,pcVar11,(allocator<char> *)((long)&posBinding.pointer.data + 7))
    ;
    glu::makeVtxFragSources(&local_350,&local_370,&local_3b8);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_280,pRVar10,&local_350);
    glu::ProgramSources::~ProgramSources(&local_350);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&posBinding.pointer.data + 7));
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_391);
    std::__cxx11::string::~string((string *)&local_390);
    bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_280);
    if (!bVar5) {
      glu::operator<<(log_00,(ShaderProgram *)local_280);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x6b6);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    p_Var1 = gl_00->useProgram;
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_280);
    (*p_Var1)(dVar7);
    GVar8 = (*gl_00->getError)();
    glu::checkError(GVar8,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6b9);
    p_Var2 = gl_00->uniform1i;
    p_Var3 = gl_00->getUniformLocation;
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_280);
    GVar9 = (*p_Var3)(dVar7,"uValue");
    (*p_Var2)(GVar9,1);
    p_Var4 = gl_00->uniform4f;
    p_Var3 = gl_00->getUniformLocation;
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_280);
    GVar9 = (*p_Var3)(dVar7,"uDefined");
    (*p_Var4)(GVar9,0.0,1.0,0.0,1.0);
    p_Var4 = gl_00->uniform4f;
    p_Var3 = gl_00->getUniformLocation;
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_280);
    GVar9 = (*p_Var3)(dVar7,"uNonDefined");
    (*p_Var4)(GVar9,1.0,0.0,1.0,1.0);
    GVar8 = (*gl_00->getError)();
    glu::checkError(GVar8,"Uniforms failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6be);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"aPos",&local_431);
    glu::va::Float((VertexArrayBinding *)local_410,&local_430,2,4,0,(float *)s_pos);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_280);
    glu::pr::Triangles((PrimitiveList *)&resultSurface.m_pixels.m_cap,6,(deUint16 *)s_indices);
    glu::draw(pRVar10,dVar7,1,(VertexArrayBinding *)local_410,
              (PrimitiveList *)&resultSurface.m_pixels.m_cap,(DrawUtilCallback *)0x0);
    GVar8 = (*gl_00->getError)();
    glu::checkError(GVar8,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6c3);
    tcu::Surface::Surface((Surface *)local_468,4,4);
    pRVar10 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    tcu::Surface::getAccess((PixelBufferAccess *)local_490,(Surface *)local_468);
    glu::readPixels(pRVar10,0,0,(PixelBufferAccess *)local_490);
    GVar8 = (*gl_00->getError)();
    glu::checkError(GVar8,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x6c8);
    local_498 = tcu::RGBA::green();
    local_49c = tcu::Surface::getPixel((Surface *)local_468,0,0);
    local_491 = tcu::RGBA::operator==(&local_498,&local_49c);
    if ((bool)local_491) {
      local_5d8 = "Pass";
    }
    else {
      local_5d8 = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!(bool)local_491
               ,local_5d8);
    tcu::Surface::~Surface((Surface *)local_468);
    glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_410);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_280);
    std::__cxx11::string::~string((string *)local_168);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_88);
    FBOSentry::~FBOSentry((FBOSentry *)local_48);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

PreprocessorCaseGroup::PreprocessorCase::IterateResult PreprocessorCaseGroup::PreprocessorCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	const int			  dim = 4;

	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);
	gl.clearColor(0.125f, 0.125f, 0.125f, 1.f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Test that GL_KHR_blend_equation_advanced is defined and it has value 1.
	// Renders green pixels if above is true, red pixels otherwise.
	static const char* frgSrcTemplate = "${VERSION_DIRECTIVE}\n"
										"${EXTENSION_DIRECTIVE}\n"
										"precision highp float;\n"
										"\n"
										"uniform vec4 uDefined;\n"
										"uniform vec4 uNonDefined;\n"
										"\n"
										"uniform int  uValue;\n"
										"\n"
										"layout(location = 0) out vec4 oCol;\n"
										"\n"
										"void main (void) {\n"
										"    vec4 col = uNonDefined;\n"
										"#if defined(GL_KHR_blend_equation_advanced)\n"
										"    int val = GL_KHR_blend_equation_advanced;\n"
										"    if (uValue == val) {\n"
										"        col = uDefined;\n"
										"    }\n"
										"#endif\n"
										"    oCol = col;\n"
										"}\n";

	std::map<std::string, std::string> args;
	args["VERSION_DIRECTIVE"] = glu::getGLSLVersionDeclaration(m_glslVersion);
	if (m_behaviour)
		args["EXTENSION_DIRECTIVE"] = std::string("#extension GL_KHR_blend_equation_advanced : ") + m_behaviour;
	else
		args["EXTENSION_DIRECTIVE"] = "";
	std::string frgSrc				= tcu::StringTemplate(frgSrcTemplate).specialize(args);

	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}
	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	gl.uniform1i(gl.getUniformLocation(p.getProgram(), "uValue"), 1);
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uDefined"), 0.f, 1.f, 0.f, 1.f);
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uNonDefined"), 1.f, 0.f, 1.f, 1.f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
	glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

	// Check the results.
	tcu::Surface resultSurface(dim, dim);
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
	bool pass = tcu::RGBA::green() == resultSurface.getPixel(0, 0);

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

	return STOP;
}